

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O1

Validity * __thiscall
capnp::compiler::CompilerMain::setRootType
          (Validity *__return_storage_ptr__,CompilerMain *this,StringPtr input)

{
  uint uVar1;
  uint uVar2;
  SourceFile *pSVar3;
  uint uVar4;
  Builder result;
  Reader expression;
  bool bVar5;
  char *pcVar6;
  long lVar7;
  StructSchema SVar8;
  ListReader **ppLVar9;
  ulong uVar10;
  ListReader **ppLVar11;
  ulong uVar12;
  uint32_t startByte;
  size_t sVar13;
  Orphanage orphanageParam;
  StringPtr message;
  StringPtr message_00;
  StringPtr message_01;
  StringPtr message_02;
  ArrayPtr<const_char> input_00;
  CliArgumentErrorReporter errorReporter;
  ParserInput parserInput;
  NullableValue<capnp::compiler::Compiler::CompiledType> _compiledType1251;
  NullableValue<capnp::Orphan<capnp::compiler::Expression>_> _expression1246;
  NullableValue<capnp::Type> _type1252;
  Builder lexedTokens;
  Reader tokens;
  CapnpParser parser;
  MallocMessageBuilder tokenArena;
  ErrorReporter local_560;
  char local_558;
  char *local_550;
  size_t sStack_548;
  ArrayDisposer *local_540;
  long local_538;
  ListReader *local_530;
  ElementCount local_528 [2];
  ListReader *local_520;
  ElementCount local_518;
  ListReader *local_510;
  uint local_508;
  undefined1 local_500 [8];
  CompiledType CStack_4f8;
  char local_440;
  OrphanBuilder local_438;
  undefined1 local_418 [8];
  undefined1 local_410 [184];
  Maybe<capnp::Type> local_358;
  StructBuilder local_340;
  StructReader local_318;
  ListReader local_2e8;
  undefined1 local_2b8 [136];
  void *local_230;
  Wrapper *local_228;
  MallocMessageBuilder local_120;
  
  lVar7 = (long)(this->sourceFiles).builder.pos - (long)(this->sourceFiles).builder.ptr;
  local_2b8._0_8_ = (lVar7 >> 3) * 0x6db6db6db6db6db7;
  local_2b8._8_4_ = 1;
  local_2b8._16_8_ = " == ";
  local_2b8._24_8_ = 5;
  local_2b8[0x20] = lVar7 == 0x38;
  if (!local_2b8[0x20]) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
              ((Fault *)&local_120,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/capnp.c++"
               ,0x4b0,FAILED,"sourceFiles.size() == 1","_kjCondition,",
               (DebugComparison<unsigned_long,_int> *)local_2b8);
    kj::_::Debug::Fault::fatal((Fault *)&local_120);
  }
  local_560._vptr_ErrorReporter = (_func_int **)&PTR_StringPtr__002897d0;
  local_558 = '\0';
  MallocMessageBuilder::MallocMessageBuilder(&local_120,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)local_500,&local_120.super_MessageBuilder);
  local_2b8._16_8_ = CStack_4f8.decl.mutex;
  local_2b8._8_8_ = CStack_4f8.compiler;
  capnp::_::PointerBuilder::initStruct(&local_340,(PointerBuilder *)local_2b8,(StructSize)0x10000);
  sVar13 = input.content.size_ - 1;
  result._builder.capTable = local_340.capTable;
  result._builder.segment = local_340.segment;
  result._builder.data = local_340.data;
  result._builder.pointers = local_340.pointers;
  result._builder.dataSize = local_340.dataSize;
  result._builder.pointerCount = local_340.pointerCount;
  result._builder._38_2_ = local_340._38_2_;
  input_00.size_ = sVar13;
  input_00.ptr = input.content.ptr;
  lex(input_00,result,&local_560);
  orphanageParam = MessageBuilder::getOrphanage(&local_120.super_MessageBuilder);
  CapnpParser::CapnpParser((CapnpParser *)local_2b8,orphanageParam,&local_560);
  capnp::_::StructBuilder::asReader(&local_340);
  if (CStack_4f8.decl.value.body.field_1._4_2_ == 0) {
    local_410._16_4_ = 0x7fffffff;
    local_410._0_8_ = (Compiler *)0x0;
    local_410._8_8_ = (SegmentBuilder *)0x0;
    local_418 = (undefined1  [8])0x0;
  }
  else {
    local_418 = (undefined1  [8])CONCAT71(local_500._1_7_,local_500[0]);
    local_410._8_8_ = CONCAT44(CStack_4f8.decl.value.body._4_4_,CStack_4f8.decl.value.body.tag);
    local_410._0_8_ = CStack_4f8.compiler;
    local_410._16_4_ = CStack_4f8.decl.value.body.field_1._8_4_;
  }
  capnp::_::PointerReader::getList
            (&local_2e8,(PointerReader *)local_418,INLINE_COMPOSITE,(word *)0x0);
  local_538 = 0;
  local_528[0] = 0;
  local_518 = local_2e8.elementCount;
  local_508 = 0;
  local_530 = &local_2e8;
  local_520 = &local_2e8;
  local_510 = &local_2e8;
  if (local_2e8.elementCount == 0) {
    message.content.size_ = 0x1a;
    message.content.ptr = "Couldn\'t parse type name.";
    setRootType(kj::StringPtr)::CliArgumentErrorReporter::addError(unsigned_int,unsigned_int,kj::
    StringPtr_(&local_560,0,0,message);
  }
  else {
    (*(code *)**(undefined8 **)local_228)(local_500,local_228,local_230);
    local_440 = local_500[0];
    if (local_500[0] == '\x01') {
      local_438.location = (word *)CStack_4f8.decl.value.body.field_1._0_8_;
      local_438.tag.content = (uint64_t)CStack_4f8.compiler;
      local_438.segment = (SegmentBuilder *)CStack_4f8.decl.mutex;
      CStack_4f8.decl.mutex = (Mutex *)0x0;
      CStack_4f8.decl.value.body.field_1._0_8_ = (word *)0x0;
    }
    if ((local_500[0] != '\0') && ((SegmentBuilder *)CStack_4f8.decl.mutex != (SegmentBuilder *)0x0)
       ) {
      capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)(local_500 + 8));
    }
    if (local_440 == '\x01') {
      if (local_528[0] != local_2e8.elementCount) {
        capnp::_::ListReader::getStructElement((StructReader *)local_500,local_530,local_528[0]);
        uVar10 = 0;
        uVar12 = 0;
        if (0x3f < (uint)CStack_4f8.decl.value.body.field_1._0_4_) {
          uVar12 = (ulong)*(uint *)((long)&((SegmentReader *)&(CStack_4f8.decl.mutex)->futex)->arena
                                   + 4);
        }
        if (0x9f < (uint)CStack_4f8.decl.value.body.field_1._0_4_) {
          uVar10 = (ulong)*(uint *)&(((SegmentReader *)&(CStack_4f8.decl.mutex)->futex)->ptr).ptr;
        }
        (**local_560._vptr_ErrorReporter)
                  (&local_560,uVar12,uVar10,"Couldn\'t parse type name.",0x1a);
        goto LAB_0011e1b6;
      }
      pSVar3 = (this->sourceFiles).builder.ptr;
      capnp::_::OrphanBuilder::asStructReader(&local_318,&local_438,(StructSize)0x20003);
      expression._reader.capTable = local_318.capTable;
      expression._reader.segment = local_318.segment;
      expression._reader.data = local_318.data;
      expression._reader.pointers = local_318.pointers;
      expression._reader.dataSize = local_318.dataSize;
      expression._reader.pointerCount = local_318.pointerCount;
      expression._reader._38_2_ = local_318._38_2_;
      expression._reader.nestingLimit = local_318.nestingLimit;
      expression._reader._44_4_ = local_318._44_4_;
      Compiler::ModuleScope::evalType
                ((Maybe<capnp::compiler::Compiler::CompiledType> *)local_418,&pSVar3->compiled,
                 expression,&local_560);
      local_500[0] = local_418[0];
      if ((bool)local_418[0] == true) {
        CStack_4f8.compiler = (Compiler *)local_410._0_8_;
        CStack_4f8.decl.mutex = (Mutex *)local_410._8_8_;
        CStack_4f8.decl.value.body.tag = local_410._16_4_;
        if (local_410._16_4_ == 2) {
          CStack_4f8.decl.value.body.field_1._0_8_ = local_410._24_8_;
          CStack_4f8.decl.value.body.field_1._8_8_ = local_410._32_8_;
        }
        else if (local_410._16_4_ == 1) {
          CStack_4f8.decl.value.body.field_1._32_8_ = local_410._56_8_;
          CStack_4f8.decl.value.body.field_1._16_8_ = local_410._40_8_;
          CStack_4f8.decl.value.body.field_1._24_8_ = local_410._48_8_;
          CStack_4f8.decl.value.body.field_1._0_8_ = local_410._24_8_;
          CStack_4f8.decl.value.body.field_1._8_8_ = local_410._32_8_;
          CStack_4f8.decl.value.body.field_1.space[0x28] = local_410[0x40];
          if (local_410[0x40] == '\x01') {
            CStack_4f8.decl.value.body.field_1._80_8_ = local_410._104_8_;
            CStack_4f8.decl.value.body.field_1._88_8_ = local_410._112_8_;
            CStack_4f8.decl.value.body.field_1._64_8_ = local_410._88_8_;
            CStack_4f8.decl.value.body.field_1._72_8_ = local_410._96_8_;
            CStack_4f8.decl.value.body.field_1._48_8_ = local_410._72_8_;
            CStack_4f8.decl.value.body.field_1._56_8_ = local_410._80_8_;
            local_410[0x40] = '\0';
          }
        }
        CStack_4f8.decl.value.brand.disposer = (Disposer *)local_410._120_8_;
        CStack_4f8.decl.value.brand.ptr = (BrandScope *)local_410._128_8_;
        local_410._128_8_ = (BrandScope *)0x0;
        CStack_4f8.decl.value.source._reader.segment = (SegmentReader *)local_410._136_8_;
        CStack_4f8.decl.value.source._reader.capTable = (CapTableReader *)local_410._144_8_;
        CStack_4f8.decl.value.source._reader.data = (void *)local_410._152_8_;
        CStack_4f8.decl.value.source._reader.pointers = (WirePointer *)local_410._160_8_;
        CStack_4f8.decl.value.source._reader.dataSize = local_410._168_4_;
        CStack_4f8.decl.value.source._reader.pointerCount = local_410._172_2_;
        CStack_4f8.decl.value.source._reader._38_2_ = local_410._174_2_;
        CStack_4f8.decl.value.source._reader._40_8_ = local_410._176_8_;
        local_410._8_8_ = (SegmentBuilder *)0x0;
        kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded
                  ((ExternalMutexGuarded<capnp::compiler::BrandedDecl> *)(local_410 + 8));
      }
      if (local_500[0] == '\x01') {
        Compiler::CompiledType::getSchema(&local_358,(CompiledType *)(local_500 + 8));
        local_418[0] = local_358.ptr.isSet;
        if (local_358.ptr.isSet == true) {
          local_410._0_8_ = local_358.ptr.field_1._0_8_;
          local_410._8_8_ = local_358.ptr.field_1.value.field_4;
        }
        if (local_358.ptr.isSet == false) {
          bVar5 = false;
          message_01.content.size_ = 0x16;
          message_01.content.ptr = "Type is not a struct.";
          setRootType(kj::StringPtr)::CliArgumentErrorReporter::
          addError(unsigned_int,unsigned_int,kj::StringPtr_(&local_560,0,0,message_01);
        }
        else if ((local_410._0_2_ == 0x10) && (local_410[2] == '\0')) {
          SVar8 = Type::asStruct((Type *)local_410);
          (this->rootType).super_Schema.raw = (RawBrandedSchema *)SVar8.super_Schema.raw;
          bVar5 = true;
        }
        else {
          bVar5 = false;
          message_02.content.size_ = 0x16;
          message_02.content.ptr = "Type is not a struct.";
          setRootType(kj::StringPtr)::CliArgumentErrorReporter::
          addError(unsigned_int,unsigned_int,kj::StringPtr_(&local_560,0,0,message_02);
        }
      }
      else {
        bVar5 = false;
      }
      if (local_500[0] == '\x01') {
        kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded
                  (&CStack_4f8.decl);
      }
    }
    else {
      if (local_528[(ulong)(local_528[0] <= local_508) * 8] == local_2e8.elementCount) {
        startByte = (uint32_t)sVar13;
        message_00.content.size_ = 0x1a;
        message_00.content.ptr = "Couldn\'t parse type name.";
        setRootType(kj::StringPtr)::CliArgumentErrorReporter::addError(unsigned_int,unsigned_int,kj
        ::StringPtr_(&local_560,startByte,startByte,message_00);
      }
      else {
        capnp::_::ListReader::getStructElement
                  ((StructReader *)local_500,
                   *(ListReader **)(local_528 + (ulong)(local_528[0] <= local_508) * 8 + -2),
                   local_528[(ulong)(local_528[0] <= local_508) * 8]);
        uVar10 = 0;
        uVar12 = 0;
        if (0x3f < (uint)CStack_4f8.decl.value.body.field_1._0_4_) {
          uVar12 = (ulong)*(uint *)((long)&((SegmentReader *)&(CStack_4f8.decl.mutex)->futex)->arena
                                   + 4);
        }
        if (0x9f < (uint)CStack_4f8.decl.value.body.field_1._0_4_) {
          uVar10 = (ulong)*(uint *)&(((SegmentReader *)&(CStack_4f8.decl.mutex)->futex)->ptr).ptr;
        }
        (**local_560._vptr_ErrorReporter)
                  (&local_560,uVar12,uVar10,"Couldn\'t parse type name.",0x1a);
      }
LAB_0011e1b6:
      bVar5 = false;
    }
    if ((local_440 == '\x01') && (local_438.segment != (SegmentBuilder *)0x0)) {
      capnp::_::OrphanBuilder::euthanize(&local_438);
    }
    if (bVar5) {
      local_418[0] = 1;
      goto LAB_0011e1f8;
    }
  }
  local_418[0] = local_558;
  if (local_558 == '\0') {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&>
              ((Fault *)local_500,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/capnp.c++"
               ,0x4fd,FAILED,"success || errorReporter.hadErrors()","_kjCondition,",
               (bool *)local_418);
    kj::_::Debug::Fault::fatal((Fault *)local_500);
  }
LAB_0011e1f8:
  if (local_558 == '\x01') {
    (__return_storage_ptr__->errorMessage).ptr.isSet = true;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr = local_550;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ = sStack_548;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.disposer = local_540;
    local_550 = (char *)0x0;
    sStack_548 = 0;
  }
  else {
    (__return_storage_ptr__->errorMessage).ptr.isSet = false;
  }
  if (local_538 != 0) {
    ppLVar11 = &local_510;
    if (local_508 < local_528[0]) {
      ppLVar11 = &local_530;
    }
    uVar1 = local_528[(ulong)(local_528[0] <= local_508) * 8];
    uVar2 = *(uint *)(local_538 + 0x30);
    uVar4 = uVar2;
    if (uVar2 < uVar1) {
      uVar4 = uVar1;
    }
    ppLVar9 = (ListReader **)(local_538 + 0x28);
    if (uVar2 < uVar1) {
      ppLVar9 = ppLVar11;
    }
    *(ListReader **)(local_538 + 0x28) = *ppLVar9;
    *(uint *)(local_538 + 0x30) = uVar4;
  }
  CapnpParser::~CapnpParser((CapnpParser *)local_2b8);
  MallocMessageBuilder::~MallocMessageBuilder(&local_120);
  sVar13 = sStack_548;
  pcVar6 = local_550;
  local_560._vptr_ErrorReporter = (_func_int **)&PTR_StringPtr__002897d0;
  if ((local_558 == '\x01') && (local_550 != (char *)0x0)) {
    local_550 = (char *)0x0;
    sStack_548 = 0;
    (**local_540->_vptr_ArrayDisposer)(local_540,pcVar6,1,sVar13,sVar13,0);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity setRootType(kj::StringPtr input) {
    KJ_ASSERT(sourceFiles.size() == 1);

    class CliArgumentErrorReporter: public ErrorReporter {
    public:
      void addError(uint32_t startByte, uint32_t endByte, kj::StringPtr message) override {
        if (startByte < endByte) {
          error = kj::str(startByte + 1, "-", endByte, ": ", message);
        } else if (startByte > 0) {
          error = kj::str(startByte + 1, ": ", message);
        } else {
          error = kj::str(message);
        }
      }

      bool hadErrors() override {
        return error != kj::none;
      }

      kj::MainBuilder::Validity getValidity() {
        KJ_IF_SOME(e, error) {
          return kj::mv(e);
        } else {
          return true;
        }
      }

    private:
      kj::Maybe<kj::String> error;
    };

    CliArgumentErrorReporter errorReporter;

    capnp::MallocMessageBuilder tokenArena;
    auto lexedTokens = tokenArena.initRoot<capnp::compiler::LexedTokens>();
    lex(input, lexedTokens, errorReporter);

    CapnpParser parser(tokenArena.getOrphanage(), errorReporter);
    auto tokens = lexedTokens.asReader().getTokens();
    CapnpParser::ParserInput parserInput(tokens.begin(), tokens.end());

    bool success = false;

    if (parserInput.getPosition() == tokens.end()) {
      // Empty argument?
      errorReporter.addError(0, 0, "Couldn't parse type name.");
    } else {
      KJ_IF_SOME(expression, parser.getParsers().expression(parserInput)) {
        // The input is expected to contain a *single* expression.
        if (parserInput.getPosition() == tokens.end()) {
          // Hooray, now parse it.
          KJ_IF_SOME(compiledType,
              sourceFiles[0].compiled.evalType(expression.getReader(), errorReporter)) {
            KJ_IF_SOME(type, compiledType.getSchema()) {
              if (type.isStruct()) {
                rootType = type.asStruct();
                success = true;
              } else {
                errorReporter.addError(0, 0, "Type is not a struct.");
              }
            } else {
              // Apparently named a file scope.
              errorReporter.addError(0, 0, "Type is not a struct.");
            }
          }
        } else {
          errorReporter.addErrorOn(parserInput.current(), "Couldn't parse type name.");
        }
      }